

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringOneofFieldGenerator::GenerateDestructorCode
          (StringOneofFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  StringOneofFieldGenerator *this_local;
  
  bVar1 = SupportsArenas((this->super_StringFieldGenerator).descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&(this->super_StringFieldGenerator).variables_,
                       "if (has_$name$()) {\n  $oneof_prefix$$name$_.Destroy($default_variable$,\n      GetArenaNoVirtual());\n}\n"
                      );
  }
  else {
    io::Printer::Print(printer,&(this->super_StringFieldGenerator).variables_,
                       "if (has_$name$()) {\n  $oneof_prefix$$name$_.DestroyNoArena($default_variable$);\n}\n"
                      );
  }
  return;
}

Assistant:

void StringOneofFieldGenerator::
GenerateDestructorCode(io::Printer* printer) const {
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
      "if (has_$name$()) {\n"
      "  $oneof_prefix$$name$_.Destroy($default_variable$,\n"
      "      GetArenaNoVirtual());\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "if (has_$name$()) {\n"
      "  $oneof_prefix$$name$_.DestroyNoArena($default_variable$);\n"
      "}\n");
  }
}